

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ParseSegment<segment_command_64,section_64>(LoadCommand cmd,RangeSink *sink)

{
  char *__string;
  char *pcVar1;
  string_view name;
  string_view name_00;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  string_view name_01;
  string_view name_02;
  char *local_90;
  string label;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (cmd.command_data._M_len < 0x48) {
LAB_0019f054:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  __string = cmd.command_data._M_str + 8;
  sVar2 = strnlen(__string,0x10);
  iVar5 = *(int *)(cmd.command_data._M_str + 0x38);
  if (sink->data_source_ == kSections) {
    iVar10 = *(int *)(cmd.command_data._M_str + 0x40);
    if (iVar10 != 0) {
      uVar4 = cmd.command_data._M_len - 0x48;
      pcVar8 = cmd.command_data._M_str + 0x48;
      local_90 = "integer overflow in addition";
      do {
        bVar11 = uVar4 < 0x50;
        uVar4 = uVar4 - 0x50;
        if (bVar11) goto LAB_0019f054;
        uVar9 = *(ulong *)(pcVar8 + 0x28);
        if (((byte)pcVar8[0x40] < 0x13) && ((0x41002U >> ((byte)pcVar8[0x40] & 0x1f) & 1) != 0)) {
          uVar9 = 0;
        }
        local_40 = strnlen(pcVar8,0x10);
        local_50 = sVar2;
        local_48 = __string;
        local_38 = pcVar8;
        absl::strings_internal::
        JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
                  (&label,(strings_internal *)&local_50,&stack0xffffffffffffffd0,1,",");
        if (iVar5 == 0) {
          uVar3 = (ulong)*(uint *)(pcVar8 + 0x30);
          if (CARRY8(uVar9,uVar3)) goto LAB_0019f065;
          if (cmd.file_data._M_len < uVar9 + uVar3) goto LAB_0019f06c;
          pcVar6 = cmd.file_data._M_str + uVar3;
          pcVar1 = (sink->file_->data_)._M_str;
          if ((pcVar1 <= pcVar6) && (pcVar6 < pcVar1 + (sink->file_->data_)._M_len)) {
            uVar7 = cmd.file_data._M_len - uVar3;
            if (uVar9 <= cmd.file_data._M_len - uVar3) {
              uVar7 = uVar9;
            }
            name_02._M_str = label._M_dataplus._M_p;
            name_02._M_len = label._M_string_length;
            RangeSink::AddFileRange(sink,"macho_section",name_02,(long)pcVar6 - (long)pcVar1,uVar7);
          }
        }
        else {
          uVar3 = (ulong)*(uint *)(pcVar8 + 0x30);
          if (CARRY8(uVar9,uVar3)) {
LAB_0019f065:
            iVar5 = 0x4b;
LAB_0019f07d:
            Throw(local_90,iVar5);
          }
          if (cmd.file_data._M_len < uVar9 + uVar3) {
LAB_0019f06c:
            iVar5 = 0x5d;
            local_90 = "region out-of-bounds";
            goto LAB_0019f07d;
          }
          uVar7 = cmd.file_data._M_len - uVar3;
          if (uVar9 <= cmd.file_data._M_len - uVar3) {
            uVar7 = uVar9;
          }
          name_01._M_str = label._M_dataplus._M_p;
          name_01._M_len = label._M_string_length;
          RangeSink::AddRange(sink,"macho_section",name_01,*(uint64_t *)(pcVar8 + 0x20),
                              *(uint64_t *)(pcVar8 + 0x28),
                              (uint64_t)
                              (cmd.file_data._M_str + (uVar3 - (long)(sink->file_->data_)._M_str)),
                              uVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label._M_dataplus._M_p != &label.field_2) {
          operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = pcVar8 + 0x50;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
  }
  else {
    if (sink->data_source_ != kSegments) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command_64, Section = section_64]"
                   );
    }
    if (iVar5 == 0) {
      uVar4 = *(ulong *)(cmd.command_data._M_str + 0x28);
      uVar9 = *(ulong *)(cmd.command_data._M_str + 0x30);
      if (CARRY8(uVar9,uVar4)) {
LAB_0019f0ac:
        Throw("integer overflow in addition",0x4b);
      }
      if (cmd.file_data._M_len < uVar9 + uVar4) {
LAB_0019f0bd:
        Throw("region out-of-bounds",0x5d);
      }
      pcVar6 = cmd.file_data._M_str + uVar4;
      pcVar8 = (sink->file_->data_)._M_str;
      if ((pcVar8 <= pcVar6) && (pcVar6 < pcVar8 + (sink->file_->data_)._M_len)) {
        uVar3 = cmd.file_data._M_len - uVar4;
        if (uVar9 <= cmd.file_data._M_len - uVar4) {
          uVar3 = uVar9;
        }
        name_00._M_str = __string;
        name_00._M_len = sVar2;
        RangeSink::AddFileRange(sink,"macho_segment",name_00,(long)pcVar6 - (long)pcVar8,uVar3);
        return;
      }
    }
    else {
      uVar4 = *(ulong *)(cmd.command_data._M_str + 0x28);
      uVar9 = *(ulong *)(cmd.command_data._M_str + 0x30);
      if (CARRY8(uVar9,uVar4)) goto LAB_0019f0ac;
      if (cmd.file_data._M_len < uVar9 + uVar4) goto LAB_0019f0bd;
      uVar3 = cmd.file_data._M_len - uVar4;
      if (uVar9 <= cmd.file_data._M_len - uVar4) {
        uVar3 = uVar9;
      }
      name._M_str = __string;
      name._M_len = sVar2;
      RangeSink::AddRange(sink,"macho_segment",name,*(uint64_t *)(cmd.command_data._M_str + 0x18),
                          *(uint64_t *)(cmd.command_data._M_str + 0x20),
                          (uint64_t)
                          (cmd.file_data._M_str + (uVar4 - (long)(sink->file_->data_)._M_str)),uVar3
                         );
    }
  }
  return;
}

Assistant:

const T* GetStructPointerAndAdvance(string_view* data) {
  const T* ret = GetStructPointer<T>(*data);
  *data = data->substr(sizeof(T));
  return ret;
}